

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
              *this,int32_t start_index,decoder_strategy *param_2)

{
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 aVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  int32_t iVar6;
  uint uVar7;
  pixel_type *ppVar8;
  triplet<unsigned_short> rb_00;
  pixel_type ra_00;
  triplet<unsigned_short> tVar9;
  pixel_type rb;
  uint32_t end_index;
  int32_t run_length;
  pixel_type ra;
  decoder_strategy *param_2_local;
  int32_t start_index_local;
  jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::decoder_strategy>
  *this_local;
  
  aVar1 = (anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5)
          this->current_line_[start_index + -1].field_2.v3;
  ppVar8 = this->current_line_ + (start_index + -1);
  uVar2 = ppVar8->field_0;
  uVar4 = ppVar8->field_1;
  tVar9.field_1.v2 = uVar4;
  tVar9.field_0.v1 = uVar2;
  ra_00.field_2.v3 = aVar1.v3;
  ra_00.field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)uVar2;
  ra_00.field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)uVar4;
  iVar6 = decode_run_pixels(this,ra_00,this->current_line_ + start_index,this->width_ - start_index)
  ;
  uVar7 = start_index + iVar6;
  if (uVar7 == this->width_) {
    this_local._4_4_ = uVar7 - start_index;
  }
  else {
    ppVar8 = this->previous_line_ + uVar7;
    uVar3 = ppVar8->field_0;
    uVar5 = ppVar8->field_1;
    rb_00.field_1 = (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)uVar5;
    rb_00.field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)uVar3;
    tVar9.field_2.v3 = aVar1.v3;
    rb_00.field_2.v3 = this->previous_line_[uVar7].field_2.v3;
    tVar9 = decode_run_interruption_pixel(this,tVar9,rb_00);
    ppVar8 = this->current_line_ + uVar7;
    ppVar8->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)(short)tVar9._0_4_;
    ppVar8->field_1 =
         (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)(short)((uint)tVar9._0_4_ >> 0x10);
    (ppVar8->field_2).v3 = (unsigned_short)tVar9.field_2;
    decrement_run_index(this);
    this_local._4_4_ = (uVar7 - start_index) + 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }